

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O2

int lookup_trace(char *chipset,char *event)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  void *__ptr;
  rnndecaddrinfo *a;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong value_00;
  uint uVar7;
  int local_848;
  uint32_t mask;
  uint32_t value;
  uint32_t addr;
  char buf [1024];
  char cmd [1024];
  
  sprintf(cmd,
          "demmt -l %s.trace -m %s -d all -e nvrm-mthd=0x20800122  -e ioctl-desc 2> /dev/null | grep dir > %s.demmt"
          ,event,chipset);
  pFVar2 = popen(cmd,"r");
  if (pFVar2 == (FILE *)0x0) {
    pcVar3 = "popen";
  }
  else {
    while (pcVar3 = fgets(buf,0x400,pFVar2), pcVar3 != (char *)0x0) {
      printf("%s",buf);
    }
    iVar1 = pclose(pFVar2);
    if (-1 < iVar1) {
      sprintf(buf,"%s.demmt",event);
      pFVar2 = fopen(buf,"r");
      if (pFVar2 == (FILE *)0x0) {
        pcVar3 = "fopen";
LAB_00102825:
        perror(pcVar3);
        return 1;
      }
      __ptr = calloc(1,0x8004);
      if (__ptr == (void *)0x0) {
        pcVar3 = "malloc";
        goto LAB_00102825;
      }
      uVar5 = 0;
LAB_0010257b:
      pcVar3 = fgets(cmd,0x400,pFVar2);
      if (pcVar3 != (char *)0x0) {
        pcVar3 = strstr(cmd,"dir:");
        if (pcVar3 == (char *)0x0) {
LAB_001026bc:
          fclose(pFVar2);
          free(__ptr);
          return 1;
        }
        __isoc99_sscanf(pcVar3 + 5,"0x%08x",&local_848);
        pcVar3 = strstr(cmd,"mmio:");
        if (pcVar3 == (char *)0x0) goto LAB_001026bc;
        __isoc99_sscanf(pcVar3 + 6,"0x%08x",&addr);
        pcVar3 = strstr(cmd,"value:");
        if (pcVar3 == (char *)0x0) goto LAB_001026bc;
        __isoc99_sscanf(pcVar3 + 7,"0x%08x",&value);
        pcVar3 = strstr(cmd,"mask:");
        if (pcVar3 == (char *)0x0) goto LAB_001026bc;
        __isoc99_sscanf(pcVar3 + 6,"0x%08x",&mask);
        uVar4 = 0;
        if (0 < (int)uVar5) {
          uVar4 = (ulong)uVar5;
        }
        for (lVar6 = 0; uVar4 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
          if ((((*(int *)((long)__ptr + lVar6) == local_848) &&
               (*(uint32_t *)((long)__ptr + lVar6 + 4) == addr)) &&
              (*(uint32_t *)((long)__ptr + lVar6 + 8) == value)) &&
             (*(uint32_t *)((long)__ptr + lVar6 + 0xc) == mask)) goto LAB_0010257b;
        }
        lVar6 = (long)(int)uVar5;
        uVar5 = uVar5 + 1;
        *(uint *)((long)__ptr + 0x8000) = uVar5;
        lVar6 = lVar6 * 0x10;
        *(int *)((long)__ptr + lVar6) = local_848;
        *(uint32_t *)((long)__ptr + lVar6 + 4) = addr;
        *(uint32_t *)((long)__ptr + lVar6 + 0xc) = mask;
        *(uint32_t *)((long)__ptr + lVar6 + 8) = value;
        goto LAB_0010257b;
      }
      fclose(pFVar2);
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      lVar6 = 0;
      while( true ) {
        if ((ulong)uVar5 * 0x10 == lVar6) {
          free(__ptr);
          return 0;
        }
        uVar4 = (ulong)*(uint *)((long)__ptr + lVar6 + 4);
        uVar7 = *(uint *)((long)__ptr + lVar6) & 1;
        value_00 = (ulong)*(uint *)((long)__ptr + lVar6 + 8);
        printf("(%c) register: %06x, value: %08x, mask: %08x ",(ulong)(uVar7 * 5 + 0x72),uVar4,
               value_00,(ulong)*(uint *)((long)__ptr + lVar6 + 0xc));
        pcVar3 = "<==";
        if (uVar7 == 0) {
          pcVar3 = "==>";
        }
        printf("%s ",pcVar3);
        a = rnndec_decodeaddr(rnnctx,rnndom,uVar4,0);
        if (a == (rnndecaddrinfo *)0x0) break;
        if (a->typeinfo == (rnntypeinfo *)0x0) {
          puts(a->name);
        }
        else {
          pcVar3 = rnndec_decodeval(rnnctx,a->typeinfo,value_00,a->width);
          printf("%s => %s\n",a->name,pcVar3);
          free(pcVar3);
        }
        rnndec_free_decaddrinfo(a);
        lVar6 = lVar6 + 0x10;
      }
      pcVar3 = "Failed to decode addr using lookup!\n";
      goto LAB_00102805;
    }
    pcVar3 = "pclose";
  }
  perror(pcVar3);
  pcVar3 = "Failed to decode trace using demmt!\n";
LAB_00102805:
  fwrite(pcVar3,0x24,1,_stderr);
  return 1;
}

Assistant:

int
lookup_trace(const char *chipset, const char *event)
{
	struct trace *t;
	int i;

	if (decode_trace(chipset, event)) {
		fprintf(stderr, "Failed to decode trace using demmt!\n");
		return 1;
	}

	if (!(t = parse_trace(event)))
		return 1;

	for (i = 0; i < t->nb_ioctl; i++) {
		struct ioctl_call *c = &t->ioctls[i];

		printf("(%c) register: %06x, value: %08x, mask: %08x ",
		       (c->dir & 0x1 ? 'w' : 'r'), c->addr, c->value, c->mask);
		printf("%s ", (c->dir & 0x1 ? "<==" : "==>"));

		if (lookup(c->addr, c->value)) {
			fprintf(stderr, "Failed to decode addr using lookup!\n");
			return 1;
		}
	}
	free(t);

	return 0;
}